

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

LY_ERR ly_vlog_build_data_path(ly_ctx *ctx,char **path)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  lysc_node *plVar5;
  lysc_node *plVar6;
  lys_module *plVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  lyd_node *node;
  lys_module *plVar14;
  lys_module *plVar15;
  
  *path = (char *)0x0;
  lVar2 = __tls_get_addr();
  iVar13 = *(int *)(lVar2 + 0x24);
  if (iVar13 == 0) {
    node = (lyd_node *)0x0;
LAB_001108ed:
    if (*(int *)(lVar2 + 0x14) == 0) {
      return LY_SUCCESS;
    }
    pbVar1 = *(byte **)(*(long *)(lVar2 + 0x18) + (ulong)(*(int *)(lVar2 + 0x14) - 1) * 8);
    if ((*pbVar1 & 0x82) != 0) {
      return LY_SUCCESS;
    }
    plVar5 = lysc_data_node(*(lysc_node **)(pbVar1 + 0x10));
    plVar6 = lyd_node_schema(node);
    if (plVar5 != plVar6) {
      return LY_SUCCESS;
    }
    plVar14 = *(lys_module **)(pbVar1 + 8);
    plVar7 = lyd_node_module(node);
    sVar8 = 0;
    plVar15 = (lys_module *)0x0;
    if (plVar7 != plVar14) {
      plVar15 = plVar14;
    }
    pcVar4 = *path;
    if (pcVar4 != (char *)0x0) {
      sVar8 = strlen(pcVar4);
    }
    if (plVar15 == (lys_module *)0x0) {
      iVar13 = 0;
    }
    else {
      sVar9 = strlen(plVar15->name);
      iVar13 = (int)sVar9 + 1;
    }
    sVar9 = strlen(*(char **)(pbVar1 + 0x28));
    pcVar4 = (char *)realloc(pcVar4,(ulong)((int)sVar9 + iVar13 + (int)sVar8 + 2));
    if (pcVar4 != (char *)0x0) {
      *path = pcVar4;
      if (plVar15 == (lys_module *)0x0) {
        pcVar11 = "";
        pcVar12 = "";
      }
      else {
        pcVar12 = plVar15->name;
        pcVar11 = ":";
      }
      sprintf(pcVar4 + (sVar8 & 0xffffffff),"/%s%s%s",pcVar12,pcVar11,*(undefined8 *)(pbVar1 + 0x28)
             );
      return LY_SUCCESS;
    }
    if (node->schema == (lysc_node *)0x0) {
      plVar14 = (lys_module *)&node[2].schema;
    }
    else {
      plVar14 = node->schema->module;
    }
    ctx = plVar14->ctx;
    pcVar4 = "ly_vlog_build_path_append";
  }
  else {
    lVar3 = *(long *)(lVar2 + 0x28);
    uVar10 = (ulong)(iVar13 - 1);
    node = *(lyd_node **)(lVar3 + uVar10 * 8);
    if (node == (lyd_node *)0x0) {
      if (iVar13 != 1) {
        __assert_fail("log_location.dnodes.count == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/log.c"
                      ,0x300,"LY_ERR ly_vlog_build_data_path(const struct ly_ctx *, char **)");
      }
      pcVar4 = strdup("/");
      *path = pcVar4;
      if (pcVar4 != (char *)0x0) {
        return LY_SUCCESS;
      }
    }
    else {
      if (node->parent == (lyd_node_inner *)0x0) {
        if (node->schema == (lysc_node *)0x0) {
          plVar5 = (lysc_node *)0x0;
        }
        else {
          plVar5 = node->schema->parent;
        }
        plVar5 = lysc_data_node(plVar5);
        if (plVar5 == (lysc_node *)0x0) {
          lVar3 = *(long *)(lVar2 + 0x28);
          uVar10 = (ulong)(*(int *)(lVar2 + 0x24) - 1);
          goto LAB_00110875;
        }
        pcVar4 = lyd_path_set((ly_set *)(lVar2 + 0x20),LYD_PATH_STD);
      }
      else {
LAB_00110875:
        pcVar4 = lyd_path(*(lyd_node **)(lVar3 + uVar10 * 8),LYD_PATH_STD,(char *)0x0,0);
      }
      *path = pcVar4;
      if (pcVar4 != (char *)0x0) goto LAB_001108ed;
    }
    pcVar4 = "ly_vlog_build_data_path";
  }
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar4);
  free(*path);
  *path = (char *)0x0;
  return LY_EMEM;
}

Assistant:

LY_ERR
ly_vlog_build_data_path(const struct ly_ctx *ctx, char **path)
{
    LY_ERR rc = LY_SUCCESS;
    const struct lyd_node *dnode = NULL;

    *path = NULL;

    if (log_location.dnodes.count) {
        dnode = log_location.dnodes.objs[log_location.dnodes.count - 1];
        if (!dnode) {
            /* special root node */
            assert(log_location.dnodes.count == 1);
            *path = strdup("/");
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
            goto cleanup;
        }

        if (dnode->parent || !lysc_data_parent(dnode->schema)) {
            /* data node with all of its parents */
            *path = lyd_path(log_location.dnodes.objs[log_location.dnodes.count - 1], LYD_PATH_STD, NULL, 0);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        } else {
            /* data parsers put all the parent nodes in the set, but they are not connected */
            *path = lyd_path_set(&log_location.dnodes, LYD_PATH_STD);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        }
    }

    /* sometimes the last node is not created yet and we only have the schema node */
    if (log_location.scnodes.count) {
        rc = ly_vlog_build_path_append(path, log_location.scnodes.objs[log_location.scnodes.count - 1], dnode);
        LY_CHECK_GOTO(rc, cleanup);
    }

cleanup:
    if (rc) {
        free(*path);
        *path = NULL;
    }
    return rc;
}